

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolver.cpp
# Opt level: O2

ChEnumMapper<chrono::ChSolver::Type> * __thiscall
chrono::my_enum_mappers::Type_mapper::operator()
          (ChEnumMapper<chrono::ChSolver::Type> *__return_storage_ptr__,Type_mapper *this,Type *mval
          )

{
  __shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_28;
  
  std::
  __shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&_Stack_28,
                 &(this->super_ChEnumMapper<chrono::ChSolver::Type>).enummap.
                  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  ChEnumMapper<chrono::ChSolver::Type>::ChEnumMapper
            (__return_storage_ptr__,
             (shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChSolver::Type>,_std::allocator<chrono::ChEnumNamePair<chrono::ChSolver::Type>_>_>_>
              *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  __return_storage_ptr__->value_ptr = mval;
  return __return_storage_ptr__;
}

Assistant:

void ChSolver::EnableWrite(bool val, const std::string& frame, const std::string& out_dir) {
    write_matrix = val;
    output_dir = out_dir;
    frame_id = frame;
}